

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O1

ssize_t write(int __fd,void *__buf,size_t __n)

{
  undefined1 auVar1 [16];
  __time_t _Var2;
  bool bVar3;
  ulong uVar4;
  int *piVar5;
  ulong uVar6;
  ssize_t sVar7;
  rpchook_t *prVar8;
  pollfd pf;
  pollfd local_38;
  
  if (g_sys_write_func == (write_pfn_t)0x0) {
    g_sys_write_func = (write_pfn_t)dlsym(0xffffffffffffffff,"write");
  }
  bVar3 = co_is_enable_sys_hook();
  if (bVar3) {
    if ((uint)__fd < 1000000) {
      prVar8 = g_rpchook_socket_fd[(uint)__fd];
    }
    else {
      prVar8 = (rpchook_t *)0x0;
    }
    if ((prVar8 != (rpchook_t *)0x0) && ((prVar8->user_flag & 0x800) == 0)) {
      _Var2 = (prVar8->write_timeout).tv_sec;
      auVar1 = SEXT816(0x20c49ba5e353f7cf) * SEXT816((prVar8->write_timeout).tv_usec);
      uVar4 = (*g_sys_write_func)(__fd,__buf,__n);
      if (((long)uVar4 < 0) && (piVar5 = __errno_location(), *piVar5 == 0xb)) {
        uVar4 = 0;
      }
      if (-1 < (long)uVar4) {
        uVar6 = uVar4;
        if (uVar4 < __n) {
          do {
            local_38.events = 0x1c;
            local_38.fd = __fd;
            local_38.revents = 0;
            poll(&local_38,1,
                 ((int)(auVar1._8_8_ >> 7) - (auVar1._12_4_ >> 0x1f)) + (int)_Var2 * 1000);
            uVar6 = (*g_sys_write_func)(__fd,(void *)((long)__buf + uVar4),__n - uVar4);
            if ((long)uVar6 < 0) {
              piVar5 = __errno_location();
              if (*piVar5 == 0xb) {
                *piVar5 = 0x7c5;
              }
            }
            else {
              uVar4 = uVar4 + uVar6;
            }
          } while ((-1 < (long)uVar6) && (uVar4 < __n));
        }
        if (0 < (long)uVar6) {
          uVar6 = uVar4;
        }
        if (uVar4 == 0) {
          uVar4 = uVar6;
        }
      }
      return uVar4;
    }
  }
  sVar7 = (*g_sys_write_func)(__fd,__buf,__n);
  return sVar7;
}

Assistant:

ssize_t write( int fd, const void *buf, size_t nbyte ) //special write which would return only on successfully writing entire data
{
	HOOK_SYS_FUNC( write );
	
	if( !co_is_enable_sys_hook() )
	{
		return g_sys_write_func( fd,buf,nbyte );
	}
	rpchook_t *lp = get_by_fd( fd );

	if( !lp || ( O_NONBLOCK & lp->user_flag ) )
	{
		ssize_t ret = g_sys_write_func( fd,buf,nbyte );
		return ret;
	}
	size_t wrotelen = 0;
	int timeout = ( lp->write_timeout.tv_sec * 1000 ) 
				+ ( lp->write_timeout.tv_usec / 1000 );

	ssize_t writeret = g_sys_write_func( fd,(const char*)buf + wrotelen,nbyte - wrotelen );
	if(writeret <0 && (errno == EAGAIN || errno == EWOULDBLOCK )){
		//retry with libco poll
		writeret = 0;
	}

	if(writeret<0){
		return writeret;
	}
	wrotelen+=writeret;

	while( wrotelen < nbyte ){//write data to socket as much as possible

		struct pollfd pf = { 0 };
		pf.fd = fd;
		pf.events = ( POLLOUT | POLLERR | POLLHUP );
		poll( &pf,1,timeout );
		//is writeable or poll timedout here
		writeret = g_sys_write_func( fd,(const char*)buf + wrotelen,nbyte - wrotelen );
		if( writeret < 0 ){
			//timeout from co_routine_poll, errno set to indicate special value
			if( errno == EAGAIN  || errno == EWOULDBLOCK ){
				//poll timed out , the socket is still unwritable
				errno = LIBCO_POLL_TIMEOUT;
			}
			break;
		}
		wrotelen += writeret ;
	}
	if (writeret <= 0 && wrotelen == 0){
		return writeret;
	}
	return wrotelen;
}